

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

void __thiscall MemoryAccountant::~MemoryAccountant(MemoryAccountant *this)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  
  pMVar2 = this->head_;
  while (pMVar2 != (MemoryAccountantAllocationNode *)0x0) {
    pMVar1 = pMVar2->next_;
    (*this->allocator_->_vptr_TestMemoryAllocator[3])
              (this->allocator_,pMVar2,0x30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x1a5);
    pMVar2 = pMVar1;
  }
  this->head_ = (MemoryAccountantAllocationNode *)0x0;
  return;
}

Assistant:

MemoryAccountant::~MemoryAccountant()
{
    clear();
}